

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O1

char * glcts::GetLayoutQualifierStr(GLenum mode)

{
  if (mode - 0x9294 < 0x1d) {
    return &DAT_01bc4fec + *(int *)(&DAT_01bc4fec + (ulong)(mode - 0x9294) * 4);
  }
  return "Blend mode not from GL_KHR_blend_equation_advanced.";
}

Assistant:

static const char* GetLayoutQualifierStr(glw::GLenum mode)
{
	switch (mode)
	{
	case GL_MULTIPLY_KHR:
		return "blend_support_multiply";
	case GL_SCREEN_KHR:
		return "blend_support_screen";
	case GL_OVERLAY_KHR:
		return "blend_support_overlay";
	case GL_DARKEN_KHR:
		return "blend_support_darken";
	case GL_LIGHTEN_KHR:
		return "blend_support_lighten";
	case GL_COLORDODGE_KHR:
		return "blend_support_colordodge";
	case GL_COLORBURN_KHR:
		return "blend_support_colorburn";
	case GL_HARDLIGHT_KHR:
		return "blend_support_hardlight";
	case GL_SOFTLIGHT_KHR:
		return "blend_support_softlight";
	case GL_DIFFERENCE_KHR:
		return "blend_support_difference";
	case GL_EXCLUSION_KHR:
		return "blend_support_exclusion";
	case GL_HSL_HUE_KHR:
		return "blend_support_hsl_hue";
	case GL_HSL_SATURATION_KHR:
		return "blend_support_hsl_saturation";
	case GL_HSL_COLOR_KHR:
		return "blend_support_hsl_color";
	case GL_HSL_LUMINOSITY_KHR:
		return "blend_support_hsl_luminosity";
	default:
		DE_ASSERT(DE_FALSE && "Blend mode not from GL_KHR_blend_equation_advanced.");
		return "Blend mode not from GL_KHR_blend_equation_advanced.";
	}
}